

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_17::LineCompositeTask::execute(LineCompositeTask *this)

{
  int iVar1;
  int iVar2;
  Data *pDVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar4;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  int iVar8;
  long lVar9;
  iterator iVar10;
  Iterator IVar11;
  pointer ppcVar12;
  size_t channel;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Iterator tmp;
  DeepCompositing *pDVar16;
  long lVar17;
  half local_9a;
  long local_98;
  long local_90;
  DeepCompositing d;
  vector<const_float_*,_std::allocator<const_float_*>_> inputs;
  vector<float,_std::allocator<float>_> output_pixel;
  
  local_98 = (long)this->_y;
  iVar1 = this->_start;
  pDVar3 = this->_Data;
  pvVar4 = this->_names;
  pvVar5 = this->_pointers;
  pvVar6 = this->_total_sizes;
  pvVar7 = this->_num_sources;
  std::vector<float,_std::allocator<float>_>::vector
            (&output_pixel,
             (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&inputs);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            (&inputs,(long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&d);
  DeepCompositing::DeepCompositing(&d);
  pDVar16 = &d;
  if (pDVar3->_comp != (DeepCompositing *)0x0) {
    pDVar16 = pDVar3->_comp;
  }
  iVar8 = (pDVar3->_dataWindow).max.x;
  iVar2 = (pDVar3->_dataWindow).min.x;
  lVar17 = (long)(((iVar8 - iVar2) + 1) * ((int)local_98 - iVar1));
  lVar14 = (long)iVar2;
  while (lVar14 <= iVar8) {
    if (pDVar3->_zback == true) {
      lVar9 = 0;
      uVar13 = 0;
      while( true ) {
        ppcVar12 = (pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        uVar15 = (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12;
        if ((ulong)((long)uVar15 >> 3) <= uVar13) break;
        inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] =
             *(float **)
              (*(long *)(*(long *)&(((pvVar5->
                                     super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar9) + lVar17 * 8);
        uVar13 = uVar13 + 1;
        lVar9 = lVar9 + 0x18;
      }
    }
    else {
      *inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
       super__Vector_impl_data._M_start =
           *(float **)
            (**(long **)&(((pvVar5->
                           super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                         )._M_impl.super__Vector_impl_data + lVar17 * 8);
      inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
      super__Vector_impl_data._M_start[1] =
           *(float **)
            (**(long **)&(((pvVar5->
                           super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                         )._M_impl.super__Vector_impl_data + lVar17 * 8);
      lVar9 = 6;
      uVar13 = 2;
      while( true ) {
        ppcVar12 = (pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        uVar15 = (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12;
        if ((ulong)((long)uVar15 >> 3) <= uVar13) break;
        inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] =
             *(float **)
              (*(long *)(*(long *)&(((pvVar5->
                                     super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar9 * 8) + lVar17 * 8);
        uVar13 = uVar13 + 1;
        lVar9 = lVar9 + 3;
      }
    }
    local_90 = lVar14;
    (*pDVar16->_vptr_DeepCompositing[2])
              (pDVar16,output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
               inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
               super__Vector_impl_data._M_start,ppcVar12,uVar15 >> 3,
               (ulong)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar17],
               (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar17]);
    iVar10._M_node = (_Base_ptr)FrameBuffer::begin(&pDVar3->_outputFrameBuffer);
    lVar14 = 0;
    while( true ) {
      IVar11 = FrameBuffer::end(&pDVar3->_outputFrameBuffer);
      if ((iterator)iVar10._M_node == IVar11._i._M_node) break;
      if (iVar10._M_node[9]._M_color == _S_black) {
        half::half(&local_9a,
                   output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)(pDVar3->_bufferMap).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar14)]);
        *(unsigned_short *)
         ((long)&(iVar10._M_node[9]._M_parent)->_M_color +
         (long)iVar10._M_node[9]._M_left * local_90 + (long)iVar10._M_node[9]._M_right * local_98) =
             local_9a._h;
      }
      else if (iVar10._M_node[9]._M_color == 2) {
        *(float *)((long)&(iVar10._M_node[9]._M_parent)->_M_color +
                  (long)iVar10._M_node[9]._M_left * local_90 +
                  (long)iVar10._M_node[9]._M_right * local_98) =
             output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(int *)((long)(pDVar3->_bufferMap).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar14)];
      }
      iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
      lVar14 = lVar14 + 4;
    }
    lVar17 = lVar17 + 1;
    iVar8 = (pDVar3->_dataWindow).max.x;
    lVar14 = local_90 + 1;
  }
  DeepCompositing::~DeepCompositing(&d);
  std::_Vector_base<const_float_*,_std::allocator<const_float_*>_>::~_Vector_base
            (&inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&output_pixel.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void LineCompositeTask::execute()
{
  composite_line(_y,_start,_Data,*_names,*_pointers,*_total_sizes,*_num_sources);
}